

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

FIOBJ http_urlstr2fiobj(char *s,size_t len)

{
  fio_str_info_s local_48;
  size_t local_30;
  ssize_t l;
  FIOBJ o;
  size_t len_local;
  char *s_local;
  
  o = len;
  len_local = (size_t)s;
  l = fiobj_str_buf(len);
  fiobj_obj2cstr(&local_48,l);
  local_30 = http_decode_url(local_48.data,(char *)len_local,o);
  if ((long)local_30 < 0) {
    fiobj_free(l);
    s_local = (char *)fiobj_str_new((char *)0x0,0);
  }
  else {
    fiobj_str_resize(l,local_30);
    s_local = (char *)l;
  }
  return (FIOBJ)s_local;
}

Assistant:

static inline FIOBJ http_urlstr2fiobj(char *s, size_t len) {
  FIOBJ o = fiobj_str_buf(len);
  ssize_t l = http_decode_url(fiobj_obj2cstr(o).data, s, len);
  if (l < 0) {
    fiobj_free(o);
    return fiobj_str_new(NULL, 0); /* empty string */
  }
  fiobj_str_resize(o, (size_t)l);
  return o;
}